

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfcn.cpp
# Opt level: O0

void qsort_descent_inplace(vector<Object,_std::allocator<Object>_> *objects,int left,int right)

{
  float fVar1;
  reference pvVar2;
  int in_EDX;
  int in_ESI;
  vector<Object,_std::allocator<Object>_> *in_RDI;
  float p;
  int j;
  int i;
  int iVar3;
  int iVar4;
  
  iVar3 = in_EDX;
  iVar4 = in_ESI;
  pvVar2 = std::vector<Object,_std::allocator<Object>_>::operator[]
                     (in_RDI,(long)((in_ESI + in_EDX) / 2));
  fVar1 = pvVar2->prob;
  while (in_ESI <= in_EDX) {
    while (pvVar2 = std::vector<Object,_std::allocator<Object>_>::operator[](in_RDI,(long)in_ESI),
          fVar1 < pvVar2->prob) {
      in_ESI = in_ESI + 1;
    }
    while (pvVar2 = std::vector<Object,_std::allocator<Object>_>::operator[](in_RDI,(long)in_EDX),
          pvVar2->prob < fVar1) {
      in_EDX = in_EDX + -1;
    }
    if (in_ESI <= in_EDX) {
      std::vector<Object,_std::allocator<Object>_>::operator[](in_RDI,(long)in_ESI);
      std::vector<Object,_std::allocator<Object>_>::operator[](in_RDI,(long)in_EDX);
      std::swap<Object>((Object *)CONCAT44(iVar4,iVar3),(Object *)CONCAT44(in_ESI,in_EDX));
      in_ESI = in_ESI + 1;
      in_EDX = in_EDX + -1;
    }
  }
  if (iVar4 < in_EDX) {
    qsort_descent_inplace
              ((vector<Object,_std::allocator<Object>_> *)CONCAT44(iVar4,iVar3),in_ESI,in_EDX);
  }
  if (in_ESI < iVar3) {
    qsort_descent_inplace
              ((vector<Object,_std::allocator<Object>_> *)CONCAT44(iVar4,iVar3),in_ESI,in_EDX);
  }
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<Object>& objects, int left, int right)
{
    int i = left;
    int j = right;
    float p = objects[(left + right) / 2].prob;

    while (i <= j)
    {
        while (objects[i].prob > p)
            i++;

        while (objects[j].prob < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(objects[i], objects[j]);

            i++;
            j--;
        }
    }

    #pragma omp parallel sections
    {
        #pragma omp section
        {
            if (left < j) qsort_descent_inplace(objects, left, j);
        }
        #pragma omp section
        {
            if (i < right) qsort_descent_inplace(objects, i, right);
        }
    }
}